

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

POOL_ctx * POOL_create_advanced(size_t numThreads,size_t queueSize,ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  ZSTD_customMem customMem_02;
  uint uVar1;
  int iVar2;
  POOL_job *pPVar3;
  pthread_t *ppVar4;
  long in_RSI;
  ulong in_RDI;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  size_t i;
  int error;
  POOL_ctx *ctx;
  POOL_ctx *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar6;
  void *in_stack_ffffffffffffffe0;
  POOL_ctx *local_8;
  
  if (in_RDI == 0) {
    local_8 = (POOL_ctx *)0x0;
  }
  else {
    customMem_00.customFree._0_4_ = in_stack_ffffffffffffffd8;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem_00.customFree._4_4_ = in_stack_ffffffffffffffdc;
    customMem_00.opaque = in_stack_ffffffffffffffe0;
    local_8 = (POOL_ctx *)ZSTD_customCalloc((size_t)in_stack_00000018,customMem_00);
    if (local_8 == (POOL_ctx *)0x0) {
      local_8 = (POOL_ctx *)0x0;
    }
    else {
      local_8->queueSize = in_RSI + 1;
      customMem_01.customFree._0_4_ = in_stack_ffffffffffffffd8;
      customMem_01.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
      customMem_01.customFree._4_4_ = in_stack_ffffffffffffffdc;
      customMem_01.opaque = local_8;
      pPVar3 = (POOL_job *)ZSTD_customCalloc((size_t)in_stack_00000018,customMem_01);
      local_8->queue = pPVar3;
      local_8->queueHead = 0;
      local_8->queueTail = 0;
      local_8->numThreadsBusy = 0;
      local_8->queueEmpty = 1;
      uVar6 = 0;
      uVar1 = pthread_mutex_init((pthread_mutex_t *)&local_8->queueMutex,(pthread_mutexattr_t *)0x0)
      ;
      uVar1 = uVar1 | uVar6;
      uVar6 = pthread_cond_init((pthread_cond_t *)&local_8->queuePushCond,(pthread_condattr_t *)0x0)
      ;
      uVar6 = uVar6 | uVar1;
      iVar2 = pthread_cond_init((pthread_cond_t *)&local_8->queuePopCond,(pthread_condattr_t *)0x0);
      if (iVar2 == 0 && uVar6 == 0) {
        local_8->shutdown = 0;
        customMem_02.customFree._0_4_ = in_stack_ffffffffffffffd8;
        customMem_02.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
        customMem_02.customFree._4_4_ = 0;
        customMem_02.opaque = local_8;
        ppVar4 = (pthread_t *)ZSTD_customCalloc((size_t)in_stack_00000018,customMem_02);
        local_8->threads = ppVar4;
        local_8->threadCapacity = 0;
        (local_8->customMem).customAlloc = in_stack_00000008;
        (local_8->customMem).customFree = in_stack_00000010;
        (local_8->customMem).opaque = in_stack_00000018;
        if ((local_8->threads == (pthread_t *)0x0) || (local_8->queue == (POOL_job *)0x0)) {
          POOL_free(in_stack_ffffffffffffffc0);
          local_8 = (POOL_ctx *)0x0;
        }
        else {
          for (uVar5 = 0; uVar5 < in_RDI; uVar5 = uVar5 + 1) {
            iVar2 = pthread_create(local_8->threads + uVar5,(pthread_attr_t *)0x0,POOL_thread,
                                   local_8);
            if (iVar2 != 0) {
              local_8->threadCapacity = uVar5;
              POOL_free(in_stack_ffffffffffffffc0);
              return (POOL_ctx *)0x0;
            }
          }
          local_8->threadCapacity = in_RDI;
          local_8->threadLimit = in_RDI;
        }
      }
      else {
        POOL_free(in_stack_ffffffffffffffc0);
        local_8 = (POOL_ctx *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

POOL_ctx* POOL_create_advanced(size_t numThreads, size_t queueSize,
                               ZSTD_customMem customMem)
{
    POOL_ctx* ctx;
    /* Check parameters */
    if (!numThreads) { return NULL; }
    /* Allocate the context and zero initialize */
    ctx = (POOL_ctx*)ZSTD_customCalloc(sizeof(POOL_ctx), customMem);
    if (!ctx) { return NULL; }
    /* Initialize the job queue.
     * It needs one extra space since one space is wasted to differentiate
     * empty and full queues.
     */
    ctx->queueSize = queueSize + 1;
    ctx->queue = (POOL_job*)ZSTD_customCalloc(ctx->queueSize * sizeof(POOL_job), customMem);
    ctx->queueHead = 0;
    ctx->queueTail = 0;
    ctx->numThreadsBusy = 0;
    ctx->queueEmpty = 1;
    {
        int error = 0;
        error |= ZSTD_pthread_mutex_init(&ctx->queueMutex, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePushCond, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePopCond, NULL);
        if (error) { POOL_free(ctx); return NULL; }
    }
    ctx->shutdown = 0;
    /* Allocate space for the thread handles */
    ctx->threads = (ZSTD_pthread_t*)ZSTD_customCalloc(numThreads * sizeof(ZSTD_pthread_t), customMem);
    ctx->threadCapacity = 0;
    ctx->customMem = customMem;
    /* Check for errors */
    if (!ctx->threads || !ctx->queue) { POOL_free(ctx); return NULL; }
    /* Initialize the threads */
    {   size_t i;
        for (i = 0; i < numThreads; ++i) {
            if (ZSTD_pthread_create(&ctx->threads[i], NULL, &POOL_thread, ctx)) {
                ctx->threadCapacity = i;
                POOL_free(ctx);
                return NULL;
        }   }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
    }
    return ctx;
}